

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.h
# Opt level: O2

void __thiscall bandit::reporter::dots::it_unknown_error(dots *this,string *desc)

{
  ostream *poVar1;
  string asStack_58 [32];
  string local_38 [32];
  
  progress_base::it_unknown_error((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_38);
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"E");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(asStack_58);
  std::operator<<(poVar1,asStack_58);
  std::__cxx11::string::~string(asStack_58);
  std::__cxx11::string::~string(local_38);
  std::ostream::flush();
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        progress_base::it_unknown_error(desc);
        stm_ << colorizer_.bad() << "E" << colorizer_.reset();
        stm_.flush();
      }